

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O2

void * parseList(SymbolContext<char> *ctx)

{
  JSONValue *__args;
  _List_node_base *this;
  undefined4 *puVar1;
  int i;
  long lVar2;
  
  this = (_List_node_base *)operator_new(0x18);
  this->_M_prev = this;
  this->_M_next = this;
  this[1]._M_next = (_List_node_base *)0x0;
  for (lVar2 = 1; lVar2 <= ctx->num_values; lVar2 = lVar2 + 1) {
    __args = (JSONValue *)ctx->values[lVar2 + -1];
    std::__cxx11::list<JSONValue,_std::allocator<JSONValue>_>::emplace_back<JSONValue>
              ((list<JSONValue,_std::allocator<JSONValue>_> *)this,__args);
    JSONValue::~JSONValue(__args);
    operator_delete(__args);
  }
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 4;
  *(_List_node_base **)(puVar1 + 2) = this;
  return puVar1;
}

Assistant:

void *parseList(const SymbolContext<char>& ctx)
{
    JSONList *l = new JSONList();
    for (int i = 1; i <= ctx.count(); i++)
    {
        JSONValue *v = ctx.value<JSONValue>(i);
        l->emplace_back(std::move(*v));
        delete v;
    }
    return new JSONValue(l); 
}